

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

char * make_GLSL_srcarg_string(Context *ctx,size_t idx,int writemask,char *buf,size_t buflen)

{
  RegisterType RVar1;
  uint uVar2;
  uint uVar3;
  MOJOSHADER_shaderType shader_type;
  uint uVar4;
  VariableList *pVVar5;
  undefined1 auVar6 [4];
  int iVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  char *pcVar13;
  char *pcVar14;
  char local_d8 [56];
  undefined8 uStack_a0;
  char acStack_98 [8];
  char rel_offset [32];
  char local_68 [8];
  char swiz_str [6];
  undefined1 local_4c [4];
  char *pcStack_48;
  char rel_swizzle [4];
  char *local_40;
  
  pcVar10 = acStack_98;
  *buf = '\0';
  pcVar11 = "";
  switch(ctx->source_args[idx].src_mod) {
  case SRCMOD_NEGATE:
    local_40 = "-";
    goto LAB_0011a88a;
  case SRCMOD_BIAS:
    local_40 = "(";
    goto LAB_0011a8df;
  case SRCMOD_BIASNEGATE:
    local_40 = "-(";
LAB_0011a8df:
    pcStack_48 = " - 0.5)";
    goto LAB_0011a935;
  case SRCMOD_SIGN:
    local_40 = "((";
    goto LAB_0011a8bc;
  case SRCMOD_SIGNNEGATE:
    local_40 = "-((";
LAB_0011a8bc:
    pcStack_48 = " - 0.5) * 2.0)";
    goto LAB_0011a935;
  case SRCMOD_COMPLEMENT:
    local_40 = "(1.0 - ";
    break;
  case SRCMOD_X2:
    local_40 = "(";
    goto LAB_0011a90f;
  case SRCMOD_X2NEGATE:
    local_40 = "-(";
LAB_0011a90f:
    pcStack_48 = " * 2.0)";
    goto LAB_0011a935;
  case SRCMOD_DZ:
    pcVar10 = "SRCMOD_DZ unsupported";
    goto LAB_0011aae2;
  case SRCMOD_DW:
    pcVar10 = "SRCMOD_DW unsupported";
LAB_0011aae2:
    uStack_a0 = 0x11aae9;
    failf(ctx,"%s",pcVar10);
    return buf;
  case SRCMOD_ABS:
    local_40 = "abs(";
    break;
  case SRCMOD_ABSNEGATE:
    local_40 = "-abs(";
    break;
  case SRCMOD_NOT:
    local_40 = "!";
LAB_0011a88a:
    pcStack_48 = "";
    goto LAB_0011a935;
  default:
    pcStack_48 = "";
    local_40 = "";
    goto LAB_0011a935;
  }
  pcStack_48 = ")";
LAB_0011a935:
  if (ctx->source_args[idx].relative == 0) {
    pcVar13 = local_d8;
    pcVar11 = get_D3D_register_string
                        (ctx,ctx->source_args[idx].regtype,ctx->source_args[idx].regnum,acStack_98,
                         0x12004b);
    snprintf(pcVar13,0x40,"%s_%s%s",ctx->shader_type_str,pcVar11,acStack_98);
    rel_offset[8] = '\0';
    rel_offset[9] = '\0';
    rel_offset[10] = '\0';
    rel_offset[0xb] = '\0';
    rel_offset[0xc] = '\0';
    rel_offset[0xd] = '\0';
    rel_offset[0xe] = '\0';
    rel_offset[0xf] = '\0';
    rel_offset[0x10] = '\0';
    rel_offset[0x11] = '\0';
    rel_offset[0x12] = '\0';
    rel_offset[0x13] = '\0';
    rel_offset[0x14] = '\0';
    rel_offset[0x15] = '\0';
    rel_offset[0x16] = '\0';
    rel_offset[0x17] = '\0';
    acStack_98[0] = '\0';
    acStack_98[1] = '\0';
    acStack_98[2] = '\0';
    acStack_98[3] = '\0';
    acStack_98[4] = '\0';
    acStack_98[5] = '\0';
    acStack_98[6] = '\0';
    acStack_98[7] = '\0';
    rel_offset[0] = '\0';
    rel_offset[1] = '\0';
    rel_offset[2] = '\0';
    rel_offset[3] = '\0';
    rel_offset[4] = '\0';
    rel_offset[5] = '\0';
    rel_offset[6] = '\0';
    rel_offset[7] = '\0';
    local_4c = (undefined1  [4])0x0;
    pcVar10 = pcVar13;
    if (ctx->source_args[idx].relative == 0) {
      pcVar8 = "";
      pcVar14 = "";
      pcVar11 = "";
      goto LAB_0011ab80;
    }
  }
  local_4c = (undefined1  [4])0x0;
  rel_offset[0x10] = '\0';
  rel_offset[0x11] = '\0';
  rel_offset[0x12] = '\0';
  rel_offset[0x13] = '\0';
  rel_offset[0x14] = '\0';
  rel_offset[0x15] = '\0';
  rel_offset[0x16] = '\0';
  rel_offset[0x17] = '\0';
  rel_offset[8] = '\0';
  rel_offset[9] = '\0';
  rel_offset[10] = '\0';
  rel_offset[0xb] = '\0';
  rel_offset[0xc] = '\0';
  rel_offset[0xd] = '\0';
  rel_offset[0xe] = '\0';
  rel_offset[0xf] = '\0';
  rel_offset[0] = '\0';
  rel_offset[1] = '\0';
  rel_offset[2] = '\0';
  rel_offset[3] = '\0';
  rel_offset[4] = '\0';
  rel_offset[5] = '\0';
  rel_offset[6] = '\0';
  rel_offset[7] = '\0';
  acStack_98[0] = '\0';
  acStack_98[1] = '\0';
  acStack_98[2] = '\0';
  acStack_98[3] = '\0';
  acStack_98[4] = '\0';
  acStack_98[5] = '\0';
  acStack_98[6] = '\0';
  acStack_98[7] = '\0';
  RVar1 = ctx->source_args[idx].regtype;
  if (RVar1 == REG_TYPE_CONST) {
    pVVar5 = ctx->source_args[idx].relative_array;
    uVar4 = pVVar5->index;
    uVar2 = ctx->source_args[idx].regnum;
    uVar12 = uVar2 - uVar4;
    if ((int)uVar12 < 0) {
      *(code **)(pcVar10 + -8) = make_GLSL_swizzle_string;
      __assert_fail("offset >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x823,
                    "const char *make_GLSL_srcarg_string(Context *, const size_t, const int, char *, const size_t)"
                   );
    }
    if (pVVar5->constant == (ConstantsList *)0x0) {
      pcVar13 = ctx->shader_type_str;
      pcVar11 = "vec4";
      pcVar10[-0x48] = -0x62;
      pcVar10[-0x47] = -0x56;
      pcVar10[-0x46] = '\x11';
      pcVar10[-0x45] = '\0';
      pcVar10[-0x44] = '\0';
      pcVar10[-0x43] = '\0';
      pcVar10[-0x42] = '\0';
      pcVar10[-0x41] = '\0';
      snprintf(pcVar10 + -0x40,0x40,"%s_uniforms_%s",pcVar13);
      if (uVar2 == uVar4) {
        pcVar13 = "ARRAYBASE_%d + ";
        goto LAB_0011aab9;
      }
      pcVar11 = (char *)(ulong)uVar12;
      pcVar10[-0x48] = '\x0e';
      pcVar10[-0x47] = -0x55;
      pcVar10[-0x46] = '\x11';
      pcVar10[-0x45] = '\0';
      pcVar10[-0x44] = '\0';
      pcVar10[-0x43] = '\0';
      pcVar10[-0x42] = '\0';
      pcVar10[-0x41] = '\0';
      snprintf(acStack_98,0x20,"(ARRAYBASE_%d + %d) + ",(ulong)uVar4);
    }
    else {
      uVar3 = pVVar5->count;
      pcVar13 = ctx->shader_type_str;
      pcVar11 = (char *)(ulong)uVar4;
      pcVar10[-0x48] = 'O';
      pcVar10[-0x47] = -0x56;
      pcVar10[-0x46] = '\x11';
      pcVar10[-0x45] = '\0';
      pcVar10[-0x44] = '\0';
      pcVar10[-0x43] = '\0';
      pcVar10[-0x42] = '\0';
      pcVar10[-0x41] = '\0';
      snprintf(pcVar10 + -0x40,0x40,"%s_const_array_%d_%d",pcVar13,pcVar11,(ulong)uVar3);
      if (uVar2 != uVar4) {
        pcVar13 = "%d + ";
        uVar4 = uVar12;
LAB_0011aab9:
        builtin_strncpy(pcVar10 + -0x48,"*\x11",4);
        pcVar10[-0x44] = '\0';
        pcVar10[-0x43] = '\0';
        pcVar10[-0x42] = '\0';
        pcVar10[-0x41] = '\0';
        snprintf(acStack_98,0x20,pcVar13,(ulong)uVar4);
      }
    }
  }
  else {
    if (RVar1 != REG_TYPE_INPUT) {
      pcVar10[-8] = '%';
      pcVar10[-7] = -0x54;
      pcVar10[-6] = '\x11';
      pcVar10[-5] = '\0';
      pcVar10[-4] = '\0';
      pcVar10[-3] = '\0';
      pcVar10[-2] = '\0';
      pcVar10[-1] = '\0';
      __assert_fail("arg->regtype == REG_TYPE_CONST",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x820,
                    "const char *make_GLSL_srcarg_string(Context *, const size_t, const int, char *, const size_t)"
                   );
    }
    builtin_strncpy(pcVar10 + -0x40,"vertex_input_array",0x13);
  }
  RVar1 = ctx->source_args[idx].relative_regtype;
  iVar9 = ctx->source_args[idx].relative_regnum;
  pcVar13 = pcVar10 + -0x80;
  pcVar10[-0x88] = '.';
  pcVar10[-0x87] = -0x55;
  pcVar10[-0x86] = '\x11';
  pcVar10[-0x85] = '\0';
  pcVar10[-0x84] = '\0';
  pcVar10[-0x83] = '\0';
  pcVar10[-0x82] = '\0';
  pcVar10[-0x81] = '\0';
  pcVar8 = get_D3D_register_string(ctx,RVar1,iVar9,local_68,(size_t)pcVar11);
  pcVar11 = ctx->shader_type_str;
  pcVar10[-0x88] = 'U';
  pcVar10[-0x87] = -0x55;
  pcVar10[-0x86] = '\x11';
  pcVar10[-0x85] = '\0';
  pcVar10[-0x84] = '\0';
  pcVar10[-0x83] = '\0';
  pcVar10[-0x82] = '\0';
  pcVar10[-0x81] = '\0';
  snprintf(pcVar13,0x40,"%s_%s%s",pcVar11,pcVar8,local_68);
  auVar6 = local_4c;
  local_4c[1] = "xyzw"[ctx->source_args[idx].relative_component];
  local_4c[0] = 0x2e;
  local_4c[3] = auVar6[3];
  local_4c[2] = 0;
  pcVar14 = "]";
  pcVar8 = "[";
  pcVar10 = pcVar10 + -0x40;
  pcVar11 = pcVar13;
LAB_0011ab80:
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[0] = '\0';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  shader_type = ctx->shader_type;
  iVar9 = ctx->source_args[idx].regnum;
  RVar1 = ctx->source_args[idx].regtype;
  pcVar13[-8] = -0x62;
  pcVar13[-7] = -0x55;
  pcVar13[-6] = '\x11';
  pcVar13[-5] = '\0';
  pcVar13[-4] = '\0';
  pcVar13[-3] = '\0';
  pcVar13[-2] = '\0';
  pcVar13[-1] = '\0';
  iVar7 = isscalar(ctx,shader_type,RVar1,iVar9);
  if (iVar7 == 0) {
    uVar4 = ctx->source_args[idx].swizzle;
    pcVar13[-8] = -0x4f;
    pcVar13[-7] = -0x55;
    pcVar13[-6] = '\x11';
    pcVar13[-5] = '\0';
    pcVar13[-4] = '\0';
    pcVar13[-3] = '\0';
    pcVar13[-2] = '\0';
    pcVar13[-1] = '\0';
    make_GLSL_swizzle_string(local_68,(ulong)uVar4,writemask,iVar9);
  }
  *(char **)(pcVar13 + -8) = pcStack_48;
  *(char **)(pcVar13 + -0x10) = local_68;
  *(char **)(pcVar13 + -0x18) = pcVar14;
  *(undefined1 **)(pcVar13 + -0x20) = local_4c;
  *(char **)(pcVar13 + -0x28) = pcVar11;
  *(char **)(pcVar13 + -0x30) = acStack_98;
  pcVar13[-0x38] = -0x10;
  pcVar13[-0x37] = -0x55;
  pcVar13[-0x36] = '\x11';
  pcVar13[-0x35] = '\0';
  pcVar13[-0x34] = '\0';
  pcVar13[-0x33] = '\0';
  pcVar13[-0x32] = '\0';
  pcVar13[-0x31] = '\0';
  snprintf(buf,0x40,"%s%s%s%s%s%s%s%s%s",local_40,pcVar10,pcVar8);
  return buf;
}

Assistant:

static const char *make_GLSL_srcarg_string(Context *ctx, const size_t idx,
                                           const int writemask, char *buf,
                                           const size_t buflen)
{
    *buf = '\0';

    if (idx >= STATICARRAYLEN(ctx->source_args))
    {
        fail(ctx, "Too many source args");
        return buf;
    } // if

    const SourceArgInfo *arg = &ctx->source_args[idx];

    const char *premod_str = "";
    const char *postmod_str = "";
    switch (arg->src_mod)
    {
        case SRCMOD_NEGATE:
            premod_str = "-";
            break;

        case SRCMOD_BIASNEGATE:
            premod_str = "-(";
            postmod_str = " - 0.5)";
            break;

        case SRCMOD_BIAS:
            premod_str = "(";
            postmod_str = " - 0.5)";
            break;

        case SRCMOD_SIGNNEGATE:
            premod_str = "-((";
            postmod_str = " - 0.5) * 2.0)";
            break;

        case SRCMOD_SIGN:
            premod_str = "((";
            postmod_str = " - 0.5) * 2.0)";
            break;

        case SRCMOD_COMPLEMENT:
            premod_str = "(1.0 - ";
            postmod_str = ")";
            break;

        case SRCMOD_X2NEGATE:
            premod_str = "-(";
            postmod_str = " * 2.0)";
            break;

        case SRCMOD_X2:
            premod_str = "(";
            postmod_str = " * 2.0)";
            break;

        case SRCMOD_DZ:
            fail(ctx, "SRCMOD_DZ unsupported"); return buf; // !!! FIXME
            postmod_str = "_dz";
            break;

        case SRCMOD_DW:
            fail(ctx, "SRCMOD_DW unsupported"); return buf; // !!! FIXME
            postmod_str = "_dw";
            break;

        case SRCMOD_ABSNEGATE:
            premod_str = "-abs(";
            postmod_str = ")";
            break;

        case SRCMOD_ABS:
            premod_str = "abs(";
            postmod_str = ")";
            break;

        case SRCMOD_NOT:
            premod_str = "!";
            break;

        case SRCMOD_NONE:
        case SRCMOD_TOTAL:
             break;  // stop compiler whining.
    } // switch

    const char *regtype_str = NULL;

    if (!arg->relative)
    {
        regtype_str = get_GLSL_varname_in_buf(ctx, arg->regtype, arg->regnum,
                                              (char *) alloca(64), 64);
    } // if

    const char *rel_lbracket = "";
    char rel_offset[32] = { '\0' };
    const char *rel_rbracket = "";
    char rel_swizzle[4] = { '\0' };
    const char *rel_regtype_str = "";
    if (arg->relative)
    {
        if (arg->regtype == REG_TYPE_INPUT)
            regtype_str=get_GLSL_input_array_varname(ctx,(char*)alloca(64),64);
        else
        {
            assert(arg->regtype == REG_TYPE_CONST);
            const int arrayidx = arg->relative_array->index;
            const int offset = arg->regnum - arrayidx;
            assert(offset >= 0);
            if (arg->relative_array->constant)
            {
                const int arraysize = arg->relative_array->count;
                regtype_str = get_GLSL_const_array_varname_in_buf(ctx,
                                arrayidx, arraysize, (char *) alloca(64), 64);
                if (offset != 0)
                    snprintf(rel_offset, sizeof (rel_offset), "%d + ", offset);
            } // if
            else
            {
                regtype_str = get_GLSL_uniform_array_varname(ctx, arg->regtype,
                                                      (char *) alloca(64), 64);
                if (offset == 0)
                {
                    snprintf(rel_offset, sizeof (rel_offset),
                             "ARRAYBASE_%d + ", arrayidx);
                } // if
                else
                {
                    snprintf(rel_offset, sizeof (rel_offset),
                             "(ARRAYBASE_%d + %d) + ", arrayidx, offset);
                } // else
            } // else
        } // else

        rel_lbracket = "[";

        rel_regtype_str = get_GLSL_varname_in_buf(ctx, arg->relative_regtype,
                                                  arg->relative_regnum,
                                                  (char *) alloca(64), 64);
        rel_swizzle[0] = '.';
        rel_swizzle[1] = swizzle_channels[arg->relative_component];
        rel_swizzle[2] = '\0';
        rel_rbracket = "]";
    } // if

    char swiz_str[6] = { '\0' };
    if (!isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum))
    {
        make_GLSL_swizzle_string(swiz_str, sizeof (swiz_str),
                                 arg->swizzle, writemask);
    } // if

    if (regtype_str == NULL)
    {
        fail(ctx, "Unknown source register type.");
        return buf;
    } // if

    snprintf(buf, buflen, "%s%s%s%s%s%s%s%s%s",
             premod_str, regtype_str, rel_lbracket, rel_offset,
             rel_regtype_str, rel_swizzle, rel_rbracket, swiz_str,
             postmod_str);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}